

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

int ParseHex(char *hex)

{
  int iVar1;
  int local_24;
  char *pcStack_20;
  int num;
  char *str;
  char *hex_local;
  
  local_24 = 0;
  pcStack_20 = hex;
  do {
    if (*pcStack_20 == '\0') {
      return local_24;
    }
    if ((*pcStack_20 < '0') || ('9' < *pcStack_20)) {
      if ((*pcStack_20 < 'a') || ('f' < *pcStack_20)) {
        if ((*pcStack_20 < 'A') || ('F' < *pcStack_20)) {
          Printf("Bad hex number: %s\n",hex);
          return 0;
        }
        iVar1 = *pcStack_20 + -0x37;
      }
      else {
        iVar1 = *pcStack_20 + -0x57;
      }
    }
    else {
      iVar1 = *pcStack_20 + -0x30;
    }
    local_24 = iVar1 + local_24 * 0x10;
    pcStack_20 = pcStack_20 + 1;
  } while( true );
}

Assistant:

int ParseHex (const char *hex)
{
	const char *str;
	int num;

	num = 0;
	str = hex;

	while (*str)
	{
		num <<= 4;
		if (*str >= '0' && *str <= '9')
			num += *str-'0';
		else if (*str >= 'a' && *str <= 'f')
			num += 10 + *str-'a';
		else if (*str >= 'A' && *str <= 'F')
			num += 10 + *str-'A';
		else {
			Printf ("Bad hex number: %s\n",hex);
			return 0;
		}
		str++;
	}

	return num;
}